

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-passwd.c
# Opt level: O1

int run_test_get_passwd(void)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  size_t sVar4;
  uv_loop_t *puVar5;
  undefined4 *puVar6;
  long extraout_RDX;
  addrinfo *ai;
  addrinfo *ai_00;
  long extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  uv_getaddrinfo_t *req;
  uv_loop_t *puVar7;
  uv_handle_t *handle;
  int *piVar8;
  long lVar9;
  uv_passwd_t pwd;
  uv_getaddrinfo_t uStack_248;
  uv_loop_t *puStack_1a8;
  uv_loop_t *puStack_1a0;
  uv_loop_t *puStack_198;
  uv_getaddrinfo_t uStack_190;
  uv_loop_t *puStack_f0;
  code *pcStack_e8;
  uv_getaddrinfo_t uStack_e0;
  uv_loop_t *puStack_40;
  char *local_30;
  long local_28;
  void *local_20;
  char *local_18;
  undefined8 local_10;
  
  puStack_40 = (uv_loop_t *)0x158cdf;
  iVar2 = uv_os_get_passwd((uv_passwd_t *)&stack0xffffffffffffffd0);
  uVar1 = local_10;
  if (iVar2 == 0) {
    if (*local_30 == '\0') goto LAB_00158da3;
    if (*local_18 == '\0') goto LAB_00158da8;
    puStack_40 = (uv_loop_t *)0x158d10;
    sVar4 = strlen((char *)local_10);
    unaff_RBX = (uv_loop_t *)uVar1;
    if (sVar4 != 1) {
      if (sVar4 != 0) {
        if (*(char *)(uVar1 + (sVar4 - 1)) == '/') {
          puStack_40 = (uv_loop_t *)0x158d2b;
          run_test_get_passwd_cold_13();
          goto LAB_00158d2b;
        }
        goto LAB_00158d34;
      }
      goto LAB_00158dda;
    }
LAB_00158d2b:
    if (*(char *)uVar1 == '/') {
LAB_00158d34:
      if (local_28 < 0) goto LAB_00158dad;
      if ((long)local_20 < 0) goto LAB_00158db2;
      unaff_RBX = (uv_loop_t *)&stack0xffffffffffffffd0;
      puStack_40 = (uv_loop_t *)0x158d51;
      uv_os_free_passwd((uv_passwd_t *)unaff_RBX);
      if (local_30 != (char *)0x0) goto LAB_00158db7;
      if (local_18 != (char *)0x0) goto LAB_00158dbc;
      if ((uv_loop_t *)local_10 != (uv_loop_t *)0x0) goto LAB_00158dc1;
      unaff_RBX = (uv_loop_t *)&stack0xffffffffffffffd0;
      puStack_40 = (uv_loop_t *)0x158d74;
      uv_os_free_passwd((uv_passwd_t *)unaff_RBX);
      if (local_30 != (char *)0x0) goto LAB_00158dc6;
      if (local_18 != (char *)0x0) goto LAB_00158dcb;
      if ((uv_loop_t *)local_10 != (uv_loop_t *)0x0) goto LAB_00158dd0;
      puStack_40 = (uv_loop_t *)0x158d91;
      iVar2 = uv_os_get_passwd((uv_passwd_t *)0x0);
      if (iVar2 == -0x16) {
        return 0;
      }
      goto LAB_00158dd5;
    }
  }
  else {
    puStack_40 = (uv_loop_t *)0x158da3;
    run_test_get_passwd_cold_1();
LAB_00158da3:
    puStack_40 = (uv_loop_t *)0x158da8;
    run_test_get_passwd_cold_15();
LAB_00158da8:
    puStack_40 = (uv_loop_t *)0x158dad;
    run_test_get_passwd_cold_14();
LAB_00158dad:
    puStack_40 = (uv_loop_t *)0x158db2;
    run_test_get_passwd_cold_4();
LAB_00158db2:
    puStack_40 = (uv_loop_t *)0x158db7;
    run_test_get_passwd_cold_5();
LAB_00158db7:
    puStack_40 = (uv_loop_t *)0x158dbc;
    run_test_get_passwd_cold_6();
LAB_00158dbc:
    puStack_40 = (uv_loop_t *)0x158dc1;
    run_test_get_passwd_cold_7();
LAB_00158dc1:
    puStack_40 = (uv_loop_t *)0x158dc6;
    run_test_get_passwd_cold_8();
LAB_00158dc6:
    puStack_40 = (uv_loop_t *)0x158dcb;
    run_test_get_passwd_cold_9();
LAB_00158dcb:
    puStack_40 = (uv_loop_t *)0x158dd0;
    run_test_get_passwd_cold_10();
LAB_00158dd0:
    puStack_40 = (uv_loop_t *)0x158dd5;
    run_test_get_passwd_cold_11();
LAB_00158dd5:
    puStack_40 = (uv_loop_t *)0x158dda;
    run_test_get_passwd_cold_12();
LAB_00158dda:
    puStack_40 = (uv_loop_t *)0x158ddf;
    run_test_get_passwd_cold_3();
  }
  puStack_40 = (uv_loop_t *)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar2 = (int)&uStack_e0;
  pcStack_e8 = (code *)0x158df1;
  puStack_40 = unaff_RBX;
  puVar5 = uv_default_loop();
  pcStack_e8 = (code *)0x158e0b;
  iVar3 = uv_getaddrinfo(puVar5,&uStack_e0,abort,(char *)0x0,(char *)0x0,(addrinfo *)0x0);
  if (iVar3 == -0x16) {
    pcStack_e8 = (code *)0x158e19;
    puVar5 = uv_default_loop();
    pcStack_e8 = (code *)0x158e38;
    iVar2 = (int)&uStack_e0;
    iVar3 = uv_getaddrinfo(puVar5,&uStack_e0,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar3 != 0) goto LAB_00158e9c;
    pcStack_e8 = (code *)0x158e41;
    puVar5 = uv_default_loop();
    iVar2 = 0;
    pcStack_e8 = (code *)0x158e4b;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00158ea1;
    if (fail_cb_called != 1) goto LAB_00158ea6;
    pcStack_e8 = (code *)0x158e5d;
    unaff_RBX = uv_default_loop();
    pcStack_e8 = (code *)0x158e71;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    pcStack_e8 = (code *)0x158e7b;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_e8 = (code *)0x158e80;
    puVar5 = uv_default_loop();
    pcStack_e8 = (code *)0x158e88;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    pcStack_e8 = (code *)0x158e9c;
    run_test_getaddrinfo_fail_cold_1();
LAB_00158e9c:
    pcStack_e8 = (code *)0x158ea1;
    run_test_getaddrinfo_fail_cold_2();
LAB_00158ea1:
    pcStack_e8 = (code *)0x158ea6;
    run_test_getaddrinfo_fail_cold_3();
LAB_00158ea6:
    pcStack_e8 = (code *)0x158eab;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_e8 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar2) goto LAB_00158ed7;
    if (extraout_RDX == 0) {
      puStack_f0 = (uv_loop_t *)0x158eca;
      pcStack_e8._0_4_ = extraout_EAX;
      uv_freeaddrinfo((addrinfo *)0x0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_e8;
    }
  }
  else {
    puStack_f0 = (uv_loop_t *)0x158ed7;
    getaddrinfo_fail_cb_cold_1();
LAB_00158ed7:
    puStack_f0 = (uv_loop_t *)0x158edc;
    getaddrinfo_fail_cb_cold_2();
  }
  puStack_f0 = (uv_loop_t *)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  puStack_198 = (uv_loop_t *)0x158eee;
  puStack_f0 = unaff_RBX;
  puVar5 = uv_default_loop();
  puStack_198 = (uv_loop_t *)0x158f08;
  iVar2 = uv_getaddrinfo(puVar5,&uStack_190,(uv_getaddrinfo_cb)0x0,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 < 0) {
    puStack_198 = (uv_loop_t *)0x158f19;
    uv_freeaddrinfo(uStack_190.addrinfo);
    puStack_198 = (uv_loop_t *)0x158f1e;
    unaff_RBX = uv_default_loop();
    puStack_198 = (uv_loop_t *)0x158f32;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_198 = (uv_loop_t *)0x158f3c;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_198 = (uv_loop_t *)0x158f41;
    puVar5 = uv_default_loop();
    puStack_198 = (uv_loop_t *)0x158f49;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_198 = (uv_loop_t *)0x158f5d;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  puStack_198 = (uv_loop_t *)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  puStack_1a0 = (uv_loop_t *)0x158f6d;
  puStack_198 = unaff_RBX;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  puStack_1a0 = (uv_loop_t *)0x158f79;
  puVar5 = uv_default_loop();
  puStack_1a0 = (uv_loop_t *)0x158f9c;
  iVar2 = uv_getaddrinfo(puVar5,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 == 0) {
    puStack_1a0 = (uv_loop_t *)0x158fa5;
    puVar5 = uv_default_loop();
    puStack_1a0 = (uv_loop_t *)0x158faf;
    uv_run(puVar5,UV_RUN_DEFAULT);
    if (getaddrinfo_cbs != 1) goto LAB_00158ff5;
    puStack_1a0 = (uv_loop_t *)0x158fbd;
    unaff_RBX = uv_default_loop();
    puStack_1a0 = (uv_loop_t *)0x158fd1;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_1a0 = (uv_loop_t *)0x158fdb;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_1a0 = (uv_loop_t *)0x158fe0;
    puVar5 = uv_default_loop();
    puStack_1a0 = (uv_loop_t *)0x158fe8;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_1a0 = (uv_loop_t *)0x158ff5;
    run_test_getaddrinfo_basic_cold_1();
LAB_00158ff5:
    puStack_1a0 = (uv_loop_t *)0x158ffa;
    run_test_getaddrinfo_basic_cold_2();
  }
  puStack_1a0 = (uv_loop_t *)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  puStack_1a0 = unaff_RBX;
  if ((uv_loop_t *)getaddrinfo_handle == puVar5) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    puStack_1a8 = (uv_loop_t *)0x159017;
    free(puVar5);
    uv_freeaddrinfo(ai);
    return extraout_EAX_00;
  }
  puStack_1a8 = (uv_loop_t *)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  puStack_1a8 = unaff_RBX;
  puVar5 = uv_default_loop();
  iVar2 = uv_getaddrinfo(puVar5,&uStack_248,(uv_getaddrinfo_cb)0x0,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 == 0) {
    uv_freeaddrinfo(uStack_248.addrinfo);
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  req = getaddrinfo_handles;
  piVar8 = callback_counts;
  lVar9 = 0;
  do {
    *piVar8 = 0;
    puVar5 = (uv_loop_t *)0x4;
    puVar6 = (undefined4 *)malloc(4);
    if (puVar6 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_00159194:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_00159199;
    }
    *puVar6 = (int)lVar9;
    req->data = puVar6;
    puVar5 = uv_default_loop();
    iVar2 = uv_getaddrinfo(puVar5,req,getaddrinfo_cuncurrent_cb,"localhost",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar2 != 0) goto LAB_00159194;
    lVar9 = lVar9 + 1;
    req = req + 1;
    piVar8 = piVar8 + 1;
  } while (lVar9 != 10);
  puVar5 = uv_default_loop();
  lVar9 = 0;
  uv_run(puVar5,UV_RUN_DEFAULT);
  do {
    if (*(int *)((long)callback_counts + lVar9) != 1) goto LAB_00159199;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x28);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
LAB_0015919e:
  run_test_getaddrinfo_concurrent_cold_3();
  handle = (uv_handle_t *)puVar5->data;
  piVar8 = callback_counts;
  puVar7 = (uv_loop_t *)&closedir_req.bufsml[1].len;
  lVar9 = 0;
  do {
    puVar7 = (uv_loop_t *)((puVar7->wq_mutex).__size + 0x18);
    if (puVar7 == puVar5) goto LAB_001591db;
    piVar8 = piVar8 + 1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar9 = extraout_RDX_00;
LAB_001591db:
  if (*(int *)&handle->data == (int)lVar9) {
    *piVar8 = *piVar8 + 1;
    free(handle);
    uv_freeaddrinfo(ai_00);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return extraout_EAX_01;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar2 = uv_is_closing(handle);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_02;
LAB_00159199:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015919e;
}

Assistant:

TEST_IMPL(get_passwd) {
  uv_passwd_t pwd;
  size_t len;
  int r;

  /* Test the normal case */
  r = uv_os_get_passwd(&pwd);
  ASSERT(r == 0);
  len = strlen(pwd.username);
  ASSERT(len > 0);

#ifdef _WIN32
  ASSERT(pwd.shell == NULL);
#else
  len = strlen(pwd.shell);
  ASSERT(len > 0);
#endif

  len = strlen(pwd.homedir);
  ASSERT(len > 0);

#ifdef _WIN32
  if (len == 3 && pwd.homedir[1] == ':')
    ASSERT(pwd.homedir[2] == '\\');
  else
    ASSERT(pwd.homedir[len - 1] != '\\');
#else
  if (len == 1)
    ASSERT(pwd.homedir[0] == '/');
  else
    ASSERT(pwd.homedir[len - 1] != '/');
#endif

#ifdef _WIN32
  ASSERT(pwd.uid == -1);
  ASSERT(pwd.gid == -1);
#else
  ASSERT(pwd.uid >= 0);
  ASSERT(pwd.gid >= 0);
#endif

  /* Test uv_os_free_passwd() */
  uv_os_free_passwd(&pwd);

  ASSERT(pwd.username == NULL);
  ASSERT(pwd.shell == NULL);
  ASSERT(pwd.homedir == NULL);

  /* Test a double free */
  uv_os_free_passwd(&pwd);

  ASSERT(pwd.username == NULL);
  ASSERT(pwd.shell == NULL);
  ASSERT(pwd.homedir == NULL);

  /* Test invalid input */
  r = uv_os_get_passwd(NULL);
  ASSERT(r == UV_EINVAL);

  return 0;
}